

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSat.c
# Opt level: O3

void Cec2_AddClausesSuper(Gia_Man_t *p,Gia_Obj_t *pNode,Vec_Ptr_t *vSuper,satoko_t *pSat)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  void **ppvVar4;
  int iVar5;
  int iVar6;
  int *lits;
  Gia_Obj_t *pGVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  Gia_Obj_t *pGVar11;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Gia_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                  ,0xe8,
                  "void Cec2_AddClausesSuper(Gia_Man_t *, Gia_Obj_t *, Vec_Ptr_t *, satoko_t *)");
  }
  if (((int)(uint)*(undefined8 *)pNode < 0) ||
     (((uint)*(undefined8 *)pNode & 0x1fffffff) == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd( pNode )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                  ,0xe9,
                  "void Cec2_AddClausesSuper(Gia_Man_t *, Gia_Obj_t *, Vec_Ptr_t *, satoko_t *)");
  }
  iVar6 = vSuper->nSize;
  lVar8 = (long)iVar6;
  lits = (int *)malloc(lVar8 * 4 + 4);
  if (0 < lVar8) {
    lVar9 = 0;
    do {
      pGVar11 = (Gia_Obj_t *)((ulong)vSuper->pArray[lVar9] & 0xfffffffffffffffe);
      pGVar7 = p->pObjs;
      if ((pGVar11 < pGVar7) || (iVar5 = p->nObjs, pGVar7 + iVar5 <= pGVar11)) goto LAB_0064ef45;
      uVar10 = (int)((long)pGVar11 - (long)pGVar7 >> 2) * -0x55555555;
      if (((int)uVar10 < 0) || (uVar1 = (p->vCopies2).nSize, (int)uVar1 <= (int)uVar10))
      goto LAB_0064ef64;
      piVar3 = (p->vCopies2).pArray;
      iVar2 = piVar3[uVar10 & 0x7fffffff];
      if (iVar2 < 0) goto LAB_0064ef83;
      *lits = ((uint)vSuper->pArray[lVar9] & 1) + iVar2 * 2;
      if ((pNode < pGVar7) || (pGVar7 + iVar5 <= pNode)) goto LAB_0064ef45;
      uVar10 = (int)((long)pNode - (long)pGVar7 >> 2) * -0x55555555;
      if (((int)uVar10 < 0) || (uVar1 <= uVar10)) goto LAB_0064ef64;
      iVar5 = piVar3[uVar10 & 0x7fffffff];
      if (iVar5 < 0) goto LAB_0064ef83;
      lits[1] = iVar5 * 2 + 1;
      iVar5 = satoko_add_clause(pSat,lits,2);
      if (iVar5 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                      ,0xf9,
                      "void Cec2_AddClausesSuper(Gia_Man_t *, Gia_Obj_t *, Vec_Ptr_t *, satoko_t *)"
                     );
      }
      lVar9 = lVar9 + 1;
      iVar5 = vSuper->nSize;
    } while (lVar9 < iVar5);
    if (0 < iVar5) {
      ppvVar4 = vSuper->pArray;
      pGVar7 = p->pObjs;
      lVar9 = 0;
      while( true ) {
        pGVar11 = (Gia_Obj_t *)((ulong)ppvVar4[lVar9] & 0xfffffffffffffffe);
        if ((pGVar11 < pGVar7) || (pGVar7 + p->nObjs <= pGVar11)) break;
        uVar10 = (int)((long)pGVar11 - (long)pGVar7 >> 2) * -0x55555555;
        if (((int)uVar10 < 0) || ((p->vCopies2).nSize <= (int)uVar10)) goto LAB_0064ef64;
        iVar2 = (p->vCopies2).pArray[uVar10 & 0x7fffffff];
        if (iVar2 < 0) goto LAB_0064ef83;
        lits[lVar9] = ((uint)ppvVar4[lVar9] & 1) + iVar2 * 2 ^ 1;
        lVar9 = lVar9 + 1;
        if (iVar5 == lVar9) goto LAB_0064eec7;
      }
      goto LAB_0064ef45;
    }
  }
  pGVar7 = p->pObjs;
LAB_0064eec7:
  if ((pGVar7 <= pNode) && (pNode < pGVar7 + p->nObjs)) {
    uVar10 = (int)((long)pNode - (long)pGVar7 >> 2) * -0x55555555;
    if ((-1 < (int)uVar10) && ((int)uVar10 < (p->vCopies2).nSize)) {
      iVar5 = (p->vCopies2).pArray[uVar10 & 0x7fffffff];
      if (-1 < iVar5) {
        lits[lVar8] = iVar5 * 2;
        iVar6 = satoko_add_clause(pSat,lits,iVar6 + 1);
        if (iVar6 == 0) {
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                        ,0x10a,
                        "void Cec2_AddClausesSuper(Gia_Man_t *, Gia_Obj_t *, Vec_Ptr_t *, satoko_t *)"
                       );
        }
        free(lits);
        return;
      }
LAB_0064ef83:
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
LAB_0064ef64:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
LAB_0064ef45:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Cec2_AddClausesSuper( Gia_Man_t * p, Gia_Obj_t * pNode, Vec_Ptr_t * vSuper, satoko_t * pSat )
{
    int fPolarFlip = 0;
    Gia_Obj_t * pFanin;
    int * pLits, nLits, RetValue, i;
    assert( !Gia_IsComplement(pNode) );
    assert( Gia_ObjIsAnd( pNode ) );
    // create storage for literals
    nLits = Vec_PtrSize(vSuper) + 1;
    pLits = ABC_ALLOC( int, nLits );
    // suppose AND-gate is A & B = C
    // add !A => !C   or   A + !C
    Vec_PtrForEachEntry( Gia_Obj_t *, vSuper, pFanin, i )
    {
        pLits[0] = Abc_Var2Lit(Cec2_ObjSatId(p, Gia_Regular(pFanin)), Gia_IsComplement(pFanin));
        pLits[1] = Abc_Var2Lit(Cec2_ObjSatId(p, pNode), 1);
        if ( fPolarFlip )
        {
            if ( Gia_Regular(pFanin)->fPhase )  pLits[0] = Abc_LitNot( pLits[0] );
            if ( pNode->fPhase )                pLits[1] = Abc_LitNot( pLits[1] );
        }
        RetValue = satoko_add_clause( pSat, pLits, 2 );
        assert( RetValue );
    }
    // add A & B => C   or   !A + !B + C
    Vec_PtrForEachEntry( Gia_Obj_t *, vSuper, pFanin, i )
    {
        pLits[i] = Abc_Var2Lit(Cec2_ObjSatId(p, Gia_Regular(pFanin)), !Gia_IsComplement(pFanin));
        if ( fPolarFlip )
        {
            if ( Gia_Regular(pFanin)->fPhase )  pLits[i] = Abc_LitNot( pLits[i] );
        }
    }
    pLits[nLits-1] = Abc_Var2Lit(Cec2_ObjSatId(p, pNode), 0);
    if ( fPolarFlip )
    {
        if ( pNode->fPhase )  pLits[nLits-1] = Abc_LitNot( pLits[nLits-1] );
    }
    RetValue = satoko_add_clause( pSat, pLits, nLits );
    assert( RetValue );
    ABC_FREE( pLits );
}